

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QPointer<QWidget>_>::end(QList<QPointer<QWidget>_> *this)

{
  QPointer<QWidget> *n;
  QArrayDataPointer<QPointer<QWidget>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QWidget>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QPointer<QWidget>_> *)0x654ee9);
  QArrayDataPointer<QPointer<QWidget>_>::operator->(in_RDI);
  n = QArrayDataPointer<QPointer<QWidget>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }